

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O2

int lj_opt_loop(jit_State *J)

{
  uint16_t *puVar1;
  byte *pbVar2;
  ushort uVar3;
  IRRef ref;
  uint32_t uVar4;
  int iVar5;
  lua_State *L;
  TValue *pTVar6;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar7;
  SnapShot *pSVar8;
  SnapEntry *pSVar9;
  int errcode;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  LoopState lps;
  
  ref = (J->cur).nins;
  uVar3 = (J->cur).nsnap;
  uVar4 = (J->cur).nsnapmap;
  lps.subst = (IRRef1 *)0x0;
  lps.sizesubst = 0;
  lps.J = J;
  errcode = lj_vm_cpcall(J->L,0,&lps,cploop_opt);
  puVar1 = &J[-1].penalty[0x25].val;
  *(ulong *)puVar1 = *(long *)puVar1 + (ulong)lps.sizesubst * -2;
  (**(code **)&J[-1].penalty[0x24].val)
            (J[-1].penalty[0x25].pc.ptr64,lps.subst,(ulong)lps.sizesubst * 2,0);
  if (errcode == 0) {
    return 0;
  }
  L = J->L;
  if (errcode == 2) {
    pTVar6 = L->top;
    aVar7 = pTVar6[-1].field_4;
    if (((aVar7.it >> 0xf < 0x1fff3) && (((int)(double)aVar7 | 2U) == 0x1a)) &&
       (iVar5 = J->instunroll, J->instunroll = iVar5 + -1, 0 < iVar5)) {
      L->top = pTVar6 + -1;
      uVar10 = uVar3 - 1;
      pSVar8 = (J->cur).snap;
      pSVar9 = (J->cur).snapmap;
      pSVar9[(uint)pSVar8[uVar10].nent + pSVar8[uVar10].mapofs] = pSVar9[pSVar8->nent];
      (J->cur).nsnapmap = uVar4;
      (J->cur).nsnap = uVar3;
      (J->guardemit).irt = '\0';
      lj_ir_rollback(J,ref);
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        if (ref <= J->bpropcache[lVar11].val) {
          J->bpropcache[lVar11].key = 0;
        }
      }
      for (uVar12 = (ulong)(ref - 1); 0x8000 < (uint)uVar12; uVar12 = uVar12 - 1) {
        pbVar2 = (byte *)((long)(J->cur).ir + uVar12 * 8 + 4);
        *pbVar2 = *pbVar2 & 0x9f;
      }
      return 1;
    }
  }
  lj_err_throw(L,errcode);
}

Assistant:

int lj_opt_loop(jit_State *J)
{
  IRRef nins = J->cur.nins;
  SnapNo nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  LoopState lps;
  int errcode;
  lps.J = J;
  lps.subst = NULL;
  lps.sizesubst = 0;
  errcode = lj_vm_cpcall(J->L, NULL, &lps, cploop_opt);
  lj_mem_freevec(J2G(J), lps.subst, lps.sizesubst, IRRef1);
  if (LJ_UNLIKELY(errcode)) {
    lua_State *L = J->L;
    if (errcode == LUA_ERRRUN && tvisnumber(L->top-1)) {  /* Trace error? */
      int32_t e = numberVint(L->top-1);
      switch ((TraceError)e) {
      case LJ_TRERR_TYPEINS:  /* Type instability. */
      case LJ_TRERR_GFAIL:  /* Guard would always fail. */
	/* Unrolling via recording fixes many cases, e.g. a flipped boolean. */
	if (--J->instunroll < 0)  /* But do not unroll forever. */
	  break;
	L->top--;  /* Remove error object. */
	loop_undo(J, nins, nsnap, nsnapmap);
	return 1;  /* Loop optimization failed, continue recording. */
      default:
	break;
      }
    }
    lj_err_throw(L, errcode);  /* Propagate all other errors. */
  }
  return 0;  /* Loop optimization is ok. */
}